

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintSmartPointer<libaom_test::CompressedVideoSource,std::unique_ptr<libaom_test::CompressedVideoSource,std::default_delete<libaom_test::CompressedVideoSource>>,void>
               (unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
                *ptr,ostream *os,int param_3)

{
  bool bVar1;
  ostream *this;
  pointer p;
  void *pvVar2;
  ostream *poVar3;
  ostream *in_RSI;
  ostream *in_stack_ffffffffffffffd8;
  unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
  *in_stack_ffffffffffffffe0;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::operator<<(in_RSI,"(nullptr)");
  }
  else {
    this = std::operator<<(in_RSI,"(ptr = ");
    p = std::
        unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
        ::get((unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
               *)this);
    pvVar2 = VoidifyPointer(p);
    poVar3 = (ostream *)std::ostream::operator<<(this,pvVar2);
    std::operator<<(poVar3,", value = ");
    std::
    unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
    ::operator*((unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
                 *)this);
    UniversalPrinter<libaom_test::CompressedVideoSource>::Print
              ((CompressedVideoSource *)this,in_stack_ffffffffffffffd8);
    std::operator<<(in_RSI,")");
  }
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}